

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  pointer pcVar1;
  long lVar2;
  FieldDescriptor *pFVar3;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var4;
  Printer *this_00;
  int iVar5;
  JavaType JVar6;
  OneofGeneratorInfo *args_1;
  LogMessage *pLVar7;
  long *plVar8;
  FieldDescriptor **ppFVar9;
  Descriptor *pDVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  uint32 uVar12;
  long lVar13;
  ulong uVar14;
  uint32 uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  java *this_01;
  bool bVar20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields_for_is_initialized_check;
  string line;
  uint32 local_b8;
  LogFinisher local_b1;
  Printer *local_b0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_a8;
  FieldDescriptor *local_88;
  iterator iStack_80;
  FieldDescriptor **local_78;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  io::Printer::Indent(printer);
  local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar10 = (this->super_MessageGenerator).descriptor_;
  bVar20 = *(int *)(*(long *)(pDVar10 + 0x10) + 0x3c) != 3;
  uVar15 = bVar20 + 2;
  if (*(char *)(*(long *)(pDVar10 + 0x20) + 0x48) == '\0') {
    uVar15 = (uint32)bVar20;
  }
  WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
  WriteUInt32ToUtf16CharSequence
            (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x68),&local_a8);
  local_b0 = printer;
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) == 0) {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = null;");
  }
  else {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = new java.lang.Object[] {\n");
    io::Printer::Indent(printer);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x6c),&local_a8);
    pDVar10 = (this->super_MessageGenerator).descriptor_;
    if (0 < *(int *)(pDVar10 + 0x6c)) {
      lVar13 = 0;
      lVar18 = 0;
      do {
        args_1 = Context::GetOneofGeneratorInfo
                           (this->context_,(OneofDescriptor *)(*(long *)(pDVar10 + 0x30) + lVar13));
        io::Printer::Print<char[11],std::__cxx11::string>
                  (local_b0,"\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n",(char (*) [11])0x3a4c60,
                   &args_1->name);
        lVar18 = lVar18 + 1;
        pDVar10 = (this->super_MessageGenerator).descriptor_;
        lVar13 = lVar13 + 0x30;
      } while (lVar18 < *(int *)(pDVar10 + 0x6c));
    }
    if (*(int *)(pDVar10 + 0x68) < 1) {
      uVar15 = 0;
    }
    else {
      lVar18 = 0;
      lVar13 = 0;
      iVar17 = 0;
      do {
        lVar16 = *(long *)(pDVar10 + 0x28);
        if (*(Descriptor **)(lVar16 + 0x50 + lVar18) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x87);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_68,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
        }
        if (*(char *)(lVar16 + 0x42 + lVar18) == '\0') {
          plVar8 = (long *)(*(long *)(lVar16 + 0x50 + lVar18) + 0x28);
        }
        else {
          lVar2 = *(long *)(lVar16 + 0x60 + lVar18);
          if (lVar2 == 0) {
            plVar8 = (long *)(*(long *)(lVar16 + 0x28 + lVar18) + 0x80);
          }
          else {
            plVar8 = (long *)(lVar2 + 0x50);
          }
        }
        iVar5 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(int)((ulong)((lVar16 - *plVar8) + lVar18) >> 3) * 0x286bca1b
                                      ]._M_t.
                                      super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                                      ._M_t + 0x10))();
        iVar17 = iVar17 + iVar5;
        lVar13 = lVar13 + 1;
        pDVar10 = (this->super_MessageGenerator).descriptor_;
        lVar18 = lVar18 + 0x98;
      } while (lVar13 < *(int *)(pDVar10 + 0x68));
      iVar5 = iVar17 + 0x3e;
      if (-1 < iVar17 + 0x1f) {
        iVar5 = iVar17 + 0x1f;
      }
      uVar15 = iVar5 >> 5;
      if (0 < iVar17) {
        uVar12 = 1;
        if (1 < (int)uVar15) {
          uVar12 = uVar15;
        }
        this_01 = (java *)0x0;
        uVar11 = extraout_RDX;
        do {
          GetBitFieldName_abi_cxx11_((string *)local_68,this_01,(int)uVar11);
          io::Printer::Print<char[15],std::__cxx11::string>
                    (local_b0,"\"$bit_field_name$\",\n",(char (*) [15])"bit_field_name",
                     (string *)local_68);
          uVar11 = extraout_RDX_00;
          if ((FieldDescriptor *)local_68._0_8_ != (FieldDescriptor *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_);
            uVar11 = extraout_RDX_01;
          }
          uVar19 = (int)this_01 + 1;
          this_01 = (java *)(ulong)uVar19;
        } while (uVar12 != uVar19);
      }
    }
    WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
    ppFVar9 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) < 1) {
      local_b8 = 0;
      uVar15 = 0;
    }
    else {
      lVar13 = 0;
      uVar15 = 0;
      local_b8 = 0;
      do {
        pFVar3 = ppFVar9[lVar13];
        if (*(once_flag **)(pFVar3 + 0x30) != (once_flag *)0x0) {
          local_68._0_8_ = FieldDescriptor::TypeOnceInit;
          local_88 = pFVar3;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar3 + 0x30),(_func_void_FieldDescriptor_ptr **)local_68,
                     &local_88);
        }
        if ((*(int *)(pFVar3 + 0x38) == 0xb) &&
           (bVar20 = FieldDescriptor::is_map_message_type(pFVar3), bVar20)) {
          local_b8 = local_b8 + 1;
        }
        else {
          uVar15 = uVar15 + (*(int *)(pFVar3 + 0x3c) == 3);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68));
    }
    WriteUInt32ToUtf16CharSequence(*(uint32 *)(*ppFVar9 + 0x44),&local_a8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)
                (ppFVar9[(long)*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) + -1] +
                0x44),&local_a8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x68),&local_a8);
    WriteUInt32ToUtf16CharSequence(local_b8,&local_a8);
    WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
    local_88 = (FieldDescriptor *)0x0;
    iStack_80._M_current = (FieldDescriptor **)0x0;
    local_78 = (FieldDescriptor **)0x0;
    pDVar10 = (this->super_MessageGenerator).descriptor_;
    if (*(int *)(pDVar10 + 0x68) < 1) {
      uVar15 = 0;
    }
    else {
      lVar13 = 0;
      lVar18 = 0;
      do {
        lVar16 = *(long *)(pDVar10 + 0x28);
        if (*(int *)(lVar16 + 0x3c + lVar13) == 2) {
LAB_002b959c:
          local_68._0_8_ = lVar16 + lVar13;
          if (iStack_80._M_current == local_78) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_88,iStack_80,(FieldDescriptor **)local_68);
          }
          else {
            *iStack_80._M_current = (FieldDescriptor *)local_68._0_8_;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
        else {
          JVar6 = GetJavaType((FieldDescriptor *)(lVar16 + lVar13));
          if (JVar6 == JAVATYPE_MESSAGE) {
            pDVar10 = FieldDescriptor::message_type
                                ((FieldDescriptor *)
                                 (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) +
                                 lVar13));
            bVar20 = HasRequiredFields(pDVar10);
            if (bVar20) {
              lVar16 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
              goto LAB_002b959c;
            }
          }
        }
        lVar18 = lVar18 + 1;
        pDVar10 = (this->super_MessageGenerator).descriptor_;
        lVar13 = lVar13 + 0x98;
      } while (lVar18 < *(int *)(pDVar10 + 0x68));
      uVar15 = (uint32)((ulong)((long)iStack_80._M_current - (long)local_88) >> 3);
    }
    WriteUInt32ToUtf16CharSequence(uVar15,&local_a8);
    if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68)) {
      lVar13 = 0;
      do {
        pFVar3 = ppFVar9[lVar13];
        if (*(Descriptor **)(pFVar3 + 0x50) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x87);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_68,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=(&local_b1,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
        }
        if (pFVar3[0x42] == (FieldDescriptor)0x0) {
          plVar8 = (long *)(*(long *)(pFVar3 + 0x50) + 0x28);
        }
        else if (*(long *)(pFVar3 + 0x60) == 0) {
          plVar8 = (long *)(*(long *)(pFVar3 + 0x28) + 0x80);
        }
        else {
          plVar8 = (long *)(*(long *)(pFVar3 + 0x60) + 0x50);
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
        .
        super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
        ._M_head_impl =
             (this->field_generators_).field_generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(int)((ulong)((long)pFVar3 - *plVar8) >> 3) * 0x286bca1b]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
             ._M_t;
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                              ._M_head_impl + 0x38))
                  (_Var4._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                   ._M_head_impl,local_b0,&local_a8);
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68));
    }
    printer = local_b0;
    io::Printer::Outdent(local_b0);
    io::Printer::Print<>(printer,"};\n");
    if (local_88 != (FieldDescriptor *)0x0) {
      operator_delete(local_88);
    }
    operator_delete__(ppFVar9);
  }
  io::Printer::Print<>(printer,"java.lang.String info =\n");
  pcVar1 = local_68 + 0x10;
  local_68._8_8_ = (char *)0x0;
  local_58[0]._M_local_buf[0] = '\0';
  local_68._0_8_ = pcVar1;
  if (local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      EscapeUtf16ToString(local_a8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar14],(string *)local_68);
      if ((char *)0x4f < (ulong)local_68._8_8_) {
        io::Printer::Print<char[7],std::__cxx11::string>
                  (local_b0,"    \"$string$\" +\n",(char (*) [7])0x3e1d6b,(string *)local_68);
        local_68._8_8_ = (char *)0x0;
        *(char *)local_68._0_8_ = '\0';
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)local_a8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1));
  }
  this_00 = local_b0;
  io::Printer::Print<char[7],std::__cxx11::string>
            (local_b0,"    \"$string$\";\n",(char (*) [7])0x3e1d6b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  io::Printer::Print<>(this_00,"return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  io::Printer::Outdent(this_00);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  if (local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16> chars;

  int flags = 0;
  if (SupportFieldPresence(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(descriptor_->oneof_decl_count(), &chars);
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16 code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}